

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkStrash.c
# Opt level: O0

Aig_Obj_t * Nwk_ManStrashNode(Aig_Man_t *p,Nwk_Obj_t *pObj)

{
  Hop_Man_t *p_00;
  Hop_Obj_t *p_01;
  anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 aVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  Aig_Obj_t *pAVar5;
  bool bVar6;
  int local_3c;
  Nwk_Obj_t *pNStack_38;
  int i;
  Nwk_Obj_t *pFanin;
  Hop_Obj_t *pRoot;
  Hop_Man_t *pMan;
  Nwk_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  p_00 = pObj->pMan->pManHop;
  p_01 = pObj->pFunc;
  iVar2 = Nwk_ObjIsNode(pObj);
  if (iVar2 != 0) {
    pHVar3 = Hop_Regular(p_01);
    pHVar4 = Hop_ManConst1(p_00);
    if (pHVar3 == pHVar4) {
      pAVar5 = Aig_ManConst1(p);
      iVar2 = Hop_IsComplement(p_01);
      p_local = (Aig_Man_t *)Aig_NotCond(pAVar5,iVar2);
    }
    else {
      local_3c = 0;
      while( true ) {
        bVar6 = false;
        if (local_3c < pObj->nFanins) {
          pNStack_38 = pObj->pFanio[local_3c];
          bVar6 = pNStack_38 != (Nwk_Obj_t *)0x0;
        }
        if (!bVar6) break;
        aVar1 = (anon_union_8_2_00a17ec8_for_Hop_Obj_t__0)pNStack_38->pCopy;
        pHVar3 = Hop_IthVar(p_00,local_3c);
        pHVar3->field_0 = aVar1;
        local_3c = local_3c + 1;
      }
      pHVar3 = Hop_Regular(p_01);
      Nwk_ManStrashNode_rec(p,pHVar3);
      pHVar3 = Hop_Regular(p_01);
      Hop_ConeUnmark_rec(pHVar3);
      pHVar3 = Hop_Regular(p_01);
      pAVar5 = (Aig_Obj_t *)(pHVar3->field_0).pData;
      iVar2 = Hop_IsComplement(p_01);
      p_local = (Aig_Man_t *)Aig_NotCond(pAVar5,iVar2);
    }
    return (Aig_Obj_t *)p_local;
  }
  __assert_fail("Nwk_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkStrash.c"
                ,0x4a,"Aig_Obj_t *Nwk_ManStrashNode(Aig_Man_t *, Nwk_Obj_t *)");
}

Assistant:

Aig_Obj_t * Nwk_ManStrashNode( Aig_Man_t * p, Nwk_Obj_t * pObj )
{
    Hop_Man_t * pMan = pObj->pMan->pManHop;
    Hop_Obj_t * pRoot = pObj->pFunc;
    Nwk_Obj_t * pFanin;
    int i;
    assert( Nwk_ObjIsNode(pObj) );
    // check the constant case
    if ( Hop_Regular(pRoot) == Hop_ManConst1(pMan) )
        return Aig_NotCond( Aig_ManConst1(p), Hop_IsComplement(pRoot) );
    // set elementary variables
    Nwk_ObjForEachFanin( pObj, pFanin, i )
        Hop_IthVar(pMan, i)->pData = pFanin->pCopy;
    // strash the AIG of this node
    Nwk_ManStrashNode_rec( p, Hop_Regular(pRoot) );
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    // return the final node
    return Aig_NotCond( (Aig_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}